

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

uint64_t nng_stat_timestamp(nng_stat *stat)

{
  return stat->s_timestamp;
}

Assistant:

uint64_t
nng_stat_timestamp(const nng_stat *stat)
{
#if NNG_ENABLE_STATS
	return ((uint64_t) stat->s_timestamp);
#else
	NNI_ARG_UNUSED(stat);
	return (0);
#endif
}